

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlSplitQName(xmlParserCtxtPtr ctxt,xmlChar *name,xmlChar **prefix)

{
  byte bVar1;
  uint val;
  int iVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  size_t __n;
  byte *cur;
  size_t sVar8;
  int l;
  xmlChar buf [105];
  
  if ((prefix == (xmlChar **)0x0) || (*prefix = (xmlChar *)0x0, name == (xmlChar *)0x0)) {
    return (xmlChar *)0x0;
  }
  bVar1 = *name;
  if (bVar1 == 0x3a) goto LAB_00155249;
  uVar7 = 0;
  while ((bVar1 != 0 && (bVar1 != 0x3a))) {
    if (uVar7 == 100) {
      __n = 100;
      goto LAB_001552b5;
    }
    buf[uVar7] = bVar1;
    lVar6 = uVar7 + 1;
    uVar7 = uVar7 + 1;
    bVar1 = name[lVar6];
  }
  if (uVar7 < 100) {
    cur = name + uVar7 + 1;
    lVar6 = 100;
    pxVar3 = (xmlChar *)0x0;
LAB_00155344:
    if ((bVar1 == 0x3a) && (*cur == 0)) {
      if (pxVar3 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar3);
      }
      *prefix = (xmlChar *)0x0;
LAB_00155249:
      pxVar3 = xmlStrdup(name);
      return pxVar3;
    }
    if (pxVar3 == (xmlChar *)0x0) {
      pxVar3 = xmlStrndup(buf,(int)uVar7);
    }
    else {
      lVar6 = 100;
    }
    if (bVar1 != 0x3a) {
      return pxVar3;
    }
    bVar1 = *cur;
    *prefix = pxVar3;
    if (bVar1 == 0) {
      pxVar3 = "";
      iVar2 = 0;
    }
    else {
      if (((0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) && (bVar1 != 0x3a)) && (bVar1 != 0x5f)) {
        val = xmlStringCurrentChar(ctxt,cur,&l);
        if ((int)val < 0x100) {
          if ((((0x16 < val - 0xc0) && ((0x19 < (val & 0xffffffdf) - 0x41 && (val != 0x5f)))) &&
              ((int)val < 0xf8)) && (0x1e < val - 0xd8)) {
LAB_001554ac:
            xmlFatalErrMsgStr(ctxt,XML_NS_ERR_QNAME,"Name %s is not XML Namespace compliant\n",name)
            ;
          }
        }
        else {
          iVar2 = xmlCharInRange(val,&xmlIsBaseCharGroup);
          if ((iVar2 == 0) &&
             ((val - 0x302a < 0xfffffff7 && val - 0x9fa6 < 0xffffae5a) && val != 0x3007))
          goto LAB_001554ac;
        }
      }
      sVar8 = 0;
      for (uVar7 = 0; (bVar1 != 0 && ((long)uVar7 < lVar6)); uVar7 = uVar7 + 1) {
        buf[uVar7] = bVar1;
        bVar1 = cur[uVar7 + 1];
        sVar8 = sVar8 + 2;
      }
      if (lVar6 <= (long)uVar7) {
        pxVar3 = (xmlChar *)(*xmlMallocAtomic)(sVar8);
        if (pxVar3 != (xmlChar *)0x0) {
          memcpy(pxVar3,buf,uVar7);
          do {
            if (bVar1 == 0) {
              pxVar3[uVar7 & 0xffffffff] = '\0';
              return pxVar3;
            }
            pxVar4 = pxVar3;
            if ((int)sVar8 < (int)uVar7 + 10) {
              sVar8 = (size_t)(uint)((int)sVar8 * 2);
              pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar3,sVar8);
              if (pxVar4 == (xmlChar *)0x0) {
                xmlErrMemory(ctxt,(char *)0x0);
                (*xmlFree)(pxVar3);
                return (xmlChar *)0x0;
              }
            }
            pxVar4[uVar7] = bVar1;
            bVar1 = cur[uVar7 + 1];
            uVar7 = uVar7 + 1;
            pxVar3 = pxVar4;
          } while( true );
        }
        goto LAB_00155567;
      }
      pxVar3 = buf;
      iVar2 = (int)uVar7;
    }
    pxVar3 = xmlStrndup(pxVar3,iVar2);
  }
  else {
    __n = uVar7 & 0xffffffff;
LAB_001552b5:
    uVar5 = (ulong)(uint)((int)__n * 2);
    pxVar3 = (xmlChar *)(*xmlMallocAtomic)(uVar5);
    if (pxVar3 != (xmlChar *)0x0) {
      cur = name + uVar7;
      memcpy(pxVar3,buf,__n);
      while( true ) {
        cur = cur + 1;
        iVar2 = (int)uVar5;
        if ((bVar1 == 0) || (bVar1 == 0x3a)) break;
        pxVar4 = pxVar3;
        if (iVar2 < (int)__n + 10) {
          uVar5 = (ulong)(uint)(iVar2 * 2);
          pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar3,uVar5);
          if (pxVar4 == (xmlChar *)0x0) {
            (*xmlFree)(pxVar3);
            goto LAB_00155567;
          }
        }
        pxVar4[__n] = bVar1;
        __n = __n + 1;
        bVar1 = *cur;
        pxVar3 = pxVar4;
      }
      pxVar3[__n & 0xffffffff] = '\0';
      lVar6 = (long)iVar2;
      uVar7 = __n;
      goto LAB_00155344;
    }
LAB_00155567:
    pxVar3 = (xmlChar *)0x0;
    xmlErrMemory(ctxt,(char *)0x0);
  }
  return pxVar3;
}

Assistant:

xmlChar *
xmlSplitQName(xmlParserCtxtPtr ctxt, const xmlChar *name, xmlChar **prefix) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    xmlChar *buffer = NULL;
    int len = 0;
    int max = XML_MAX_NAMELEN;
    xmlChar *ret = NULL;
    const xmlChar *cur = name;
    int c;

    if (prefix == NULL) return(NULL);
    *prefix = NULL;

    if (cur == NULL) return(NULL);

#ifndef XML_XML_NAMESPACE
    /* xml: prefix is not really a namespace */
    if ((cur[0] == 'x') && (cur[1] == 'm') &&
        (cur[2] == 'l') && (cur[3] == ':'))
	return(xmlStrdup(name));
#endif

    /* nasty but well=formed */
    if (cur[0] == ':')
	return(xmlStrdup(name));

    c = *cur++;
    while ((c != 0) && (c != ':') && (len < max)) { /* tested bigname.xml */
	buf[len++] = c;
	c = *cur++;
    }
    if (len >= max) {
	/*
	 * Okay someone managed to make a huge name, so he's ready to pay
	 * for the processing speed.
	 */
	max = len * 2;

	buffer = (xmlChar *) xmlMallocAtomic(max);
	if (buffer == NULL) {
	    xmlErrMemory(ctxt, NULL);
	    return(NULL);
	}
	memcpy(buffer, buf, len);
	while ((c != 0) && (c != ':')) { /* tested bigname.xml */
	    if (len + 10 > max) {
	        xmlChar *tmp;

		max *= 2;
		tmp = (xmlChar *) xmlRealloc(buffer, max);
		if (tmp == NULL) {
		    xmlFree(buffer);
		    xmlErrMemory(ctxt, NULL);
		    return(NULL);
		}
		buffer = tmp;
	    }
	    buffer[len++] = c;
	    c = *cur++;
	}
	buffer[len] = 0;
    }

    if ((c == ':') && (*cur == 0)) {
        if (buffer != NULL)
	    xmlFree(buffer);
	*prefix = NULL;
	return(xmlStrdup(name));
    }

    if (buffer == NULL)
	ret = xmlStrndup(buf, len);
    else {
	ret = buffer;
	buffer = NULL;
	max = XML_MAX_NAMELEN;
    }


    if (c == ':') {
	c = *cur;
        *prefix = ret;
	if (c == 0) {
	    return(xmlStrndup(BAD_CAST "", 0));
	}
	len = 0;

	/*
	 * Check that the first character is proper to start
	 * a new name
	 */
	if (!(((c >= 0x61) && (c <= 0x7A)) ||
	      ((c >= 0x41) && (c <= 0x5A)) ||
	      (c == '_') || (c == ':'))) {
	    int l;
	    int first = CUR_SCHAR(cur, l);

	    if (!IS_LETTER(first) && (first != '_')) {
		xmlFatalErrMsgStr(ctxt, XML_NS_ERR_QNAME,
			    "Name %s is not XML Namespace compliant\n",
				  name);
	    }
	}
	cur++;

	while ((c != 0) && (len < max)) { /* tested bigname2.xml */
	    buf[len++] = c;
	    c = *cur++;
	}
	if (len >= max) {
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    max = len * 2;

	    buffer = (xmlChar *) xmlMallocAtomic(max);
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt, NULL);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (c != 0) { /* tested bigname2.xml */
		if (len + 10 > max) {
		    xmlChar *tmp;

		    max *= 2;
		    tmp = (xmlChar *) xmlRealloc(buffer, max);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt, NULL);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
		}
		buffer[len++] = c;
		c = *cur++;
	    }
	    buffer[len] = 0;
	}

	if (buffer == NULL)
	    ret = xmlStrndup(buf, len);
	else {
	    ret = buffer;
	}
    }

    return(ret);
}